

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

long duckdb::DatePart::PartOperator<duckdb::DatePart::CenturyOperator>::
     Operation<duckdb::date_t,long>(date_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  date_t in_EDI;
  idx_t in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_8;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(in_EDI);
  if (bVar1) {
    local_8 = CenturyOperator::Operation<duckdb::date_t,long>((date_t)0x0);
  }
  else {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              ((TemplatedValidityMask<unsigned_long> *)
               CONCAT44(in_EDI.days,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    local_8 = 0;
  }
  return local_8;
}

Assistant:

static inline TR Operation(TA input, ValidityMask &mask, idx_t idx, void *dataptr) {
			if (Value::IsFinite(input)) {
				return OP::template Operation<TA, TR>(input);
			} else {
				mask.SetInvalid(idx);
				return TR();
			}
		}